

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputInput(Node *this,ostream *os,int InputFlag)

{
  ostream *poVar1;
  string local_80;
  string local_60;
  string local_40;
  
  IOChannel = (Node *)0x0;
  IOUsing = (Node *)0x0;
  IOChPrinted = '\0';
  if (this->Tree[0] != (Node *)0x0) {
    OutputInputData(this->Tree[0],os,InputFlag);
    if (IOChPrinted == '\x01') {
      poVar1 = std::operator<<(os,";");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  if ((InputFlag & 1U) != 0) {
    Indent_abi_cxx11_(&local_60,this);
    poVar1 = std::operator<<(os,(string *)&local_60);
    poVar1 = std::operator<<(poVar1,"if (");
    GetIPChannel_abi_cxx11_(&local_80,IOChannel,InputFlag);
    poVar1 = std::operator<<(poVar1,(string *)&local_80);
    poVar1 = std::operator<<(poVar1,".fail()) { ");
    GetIPChannel_abi_cxx11_(&local_40,IOChannel,InputFlag);
    poVar1 = std::operator<<(poVar1,(string *)&local_40);
    poVar1 = std::operator<<(poVar1,".clear();");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    Indent_abi_cxx11_(&local_60,this);
    poVar1 = std::operator<<(os,(string *)&local_60);
    GetIPChannel_abi_cxx11_(&local_80,IOChannel,InputFlag);
    poVar1 = std::operator<<(poVar1,(string *)&local_80);
    poVar1 = std::operator<<(poVar1,
                             ".ignore(std::numeric_limits<std::streamsize>::max(), \'\\n\'); }");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void Node::OutputInput(
	std::ostream& os,	/**< iostream to write C++ code to */
	int InputFlag		/**< INPUT/PRINT flag */
)
{
	//
	// Initialize flags
	//
	IOChPrinted = 0;		// Channel not yet printed
	IOChannel = 0;		// No channel specified
	IOUsing = 0;			// No print using specified

	//
	// Write out input statements
	//
	if (Tree[0] != 0)
	{
		Tree[0]->OutputInputData(os, InputFlag);
	}

	//
	// Finish off input statement
	//
	if (IOChPrinted != 0)
	{
		os << ";" << std::endl;
	}
	
	//
	// Try to handle bad entries with more grace.
	// Eat the bad entry instead of letting it block the next input.
	//
	if (InputFlag & 1)
	{
		os << Indent() <<
			"if (" << GetIPChannel(IOChannel, InputFlag) <<
			".fail()) { " << 
			GetIPChannel(IOChannel, InputFlag) << ".clear();" <<
			std::endl;
		os << Indent() <<
			GetIPChannel(IOChannel, InputFlag) << 
			".ignore(std::numeric_limits<std::streamsize>::max(), '\\n'); }" <<
			std::endl;
	}
}